

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcSaveListing(char *fileName)

{
  bool bVar1;
  int iVar2;
  nullres nVar3;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcSaveListing::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcSaveListing::token), iVar2 != 0)) {
    nullcSaveListing::token = NULLC::TraceGetToken("nullc","nullcSaveListing");
    __cxa_guard_release(&nullcSaveListing::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_18,nullcSaveListing::token);
  if (NULLC::compilerCtx == (CompilerContext *)0x0) {
    NULLC::nullcLastError = "ERROR: there is no active compiler context";
  }
  else {
    bVar1 = SaveListing(NULLC::compilerCtx,fileName);
    nVar3 = '\x01';
    if (bVar1) goto LAB_0010c217;
    NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
  }
  nVar3 = '\0';
LAB_0010c217:
  NULLC::TraceScope::~TraceScope(&TStack_18);
  return nVar3;
}

Assistant:

nullres nullcSaveListing(const char *fileName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcSaveListing");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!SaveListing(*compilerCtx, fileName))
	{
		nullcLastError = compilerCtx->errorBuf;
		return 0;
	}

	return 1;
}